

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  ulong uVar1;
  uint p;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  N_Vector *v;
  long lVar6;
  realtype **h;
  realtype *q;
  N_Vector z;
  realtype *b_00;
  N_Vector y;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar7;
  undefined8 uVar8;
  code *pcVar9;
  code *pcVar10;
  realtype *stemp;
  N_Vector *vtemp;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  double *pdVar15;
  void *pvVar16;
  uint uVar17;
  uint nvec;
  realtype *new_vk_norm;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  realtype rVar21;
  double dVar22;
  double dVar23;
  double local_138;
  undefined1 local_108 [16];
  double local_48;
  
  if (S == (SUNLinearSolver)0x0) {
    uVar19 = 0xffffffff;
  }
  else {
    puVar5 = (uint *)S->content;
    p = *puVar5;
    uVar14 = (ulong)p;
    uVar2 = puVar5[2];
    uVar3 = puVar5[3];
    v = *(N_Vector **)(puVar5 + 0x18);
    lVar6 = *(long *)(puVar5 + 0x1a);
    h = *(realtype ***)(puVar5 + 0x1c);
    q = *(realtype **)(puVar5 + 0x1e);
    z = *(N_Vector *)(puVar5 + 0x20);
    b_00 = *(realtype **)(puVar5 + 0x22);
    y = *(N_Vector *)(puVar5 + 0x24);
    x_00 = *(N_Vector *)(puVar5 + 0x14);
    y_00 = *(N_Vector *)(puVar5 + 0x16);
    uVar7 = *(undefined8 *)(puVar5 + 0xc);
    uVar8 = *(undefined8 *)(puVar5 + 0x12);
    pcVar9 = *(code **)(puVar5 + 10);
    pcVar10 = *(code **)(puVar5 + 0x10);
    stemp = *(realtype **)(puVar5 + 0x26);
    vtemp = *(N_Vector **)(puVar5 + 0x28);
    puVar5[4] = 0;
    uVar4 = puVar5[1];
    rVar21 = N_VDotProd(x,x);
    if ((rVar21 != 0.0) || (NAN(rVar21))) {
      iVar12 = (*pcVar9)(uVar7,x,y);
      if (iVar12 != 0) {
LAB_0010291b:
        uVar19 = (long)(iVar12 >> 0x1f) ^ 3;
LAB_00102925:
        *(ulong *)((long)S->content + 0x20) = uVar19;
        goto LAB_0010300c;
      }
      N_VLinearSum(1.0,b,-1.0,y,y);
    }
    else {
      N_VScale(1.0,b,y);
    }
    if (x_00 == (N_Vector)0x0) {
      N_VScale(1.0,y,*v);
    }
    else {
      N_VProd(x_00,y,*v);
    }
    rVar21 = N_VDotProd(*v,*v);
    dVar22 = 0.0;
    if (0.0 < rVar21) {
      rVar21 = N_VDotProd(*v,*v);
      if (rVar21 < 0.0) {
        dVar22 = sqrt(rVar21);
      }
      else {
        dVar22 = SQRT(rVar21);
      }
    }
    *(double *)(puVar5 + 6) = dVar22;
    if (dVar22 <= delta) {
      pvVar16 = S->content;
LAB_00102eeb:
      *(undefined8 *)((long)pvVar16 + 0x20) = 0;
      uVar19 = 0;
    }
    else {
      N_VConst(0.0,z);
      if ((int)uVar3 < 0) {
LAB_00102ffc:
        *(undefined8 *)((long)S->content + 0x20) = 2;
        uVar19 = 2;
      }
      else {
        uVar17 = 0;
        local_108._8_8_ = 0;
        uVar18 = 0;
        local_108._0_8_ = dVar22;
        local_48 = dVar22;
        do {
          if ((int)p < 0) {
            N_VScale(1.0 / (double)local_108._0_8_,*v,*v);
            bVar11 = false;
          }
          else {
            uVar19 = 0;
            do {
              if (0 < (int)p) {
                memset(h[uVar19],0,uVar14 * 8);
              }
              uVar19 = uVar19 + 1;
            } while (p + 1 != uVar19);
            N_VScale(1.0 / (double)local_108._0_8_,*v,*v);
            if ((int)p < 1) {
              bVar11 = false;
            }
            else {
              bVar11 = true;
              lVar20 = 4;
              local_138 = 1.0;
              uVar19 = 0;
              do {
                puVar5[4] = puVar5[4] + 1;
                if (y_00 == (N_Vector)0x0) {
                  N_VScale(1.0,v[uVar19],y);
                }
                else {
                  N_VDiv(v[uVar19],y_00,y);
                }
                if (uVar4 - 1 < 3) {
                  N_VScale(1.0,y,v[uVar19 + 1]);
                  iVar12 = (*pcVar10)(delta,uVar8,v[uVar19 + 1],y,2);
                  if (iVar12 != 0) {
                    uVar19 = (long)(iVar12 >> 0x1f) ^ 5;
                    goto LAB_00102925;
                  }
                }
                N_VScale(1.0,y,*(N_Vector *)(lVar6 + uVar19 * 8));
                iVar12 = (*pcVar9)(uVar7,y,v[uVar19 + 1]);
                if (iVar12 != 0) goto LAB_0010291b;
                if (x_00 != (N_Vector)0x0) {
                  N_VProd(x_00,v[uVar19 + 1],v[uVar19 + 1]);
                }
                uVar1 = uVar19 + 1;
                new_vk_norm = (realtype *)((long)h[uVar19 + 1] + lVar20 + -4);
                iVar12 = (int)uVar1;
                if (uVar2 == 2) {
                  iVar13 = ClassicalGS(v,h,iVar12,p,new_vk_norm,stemp,vtemp);
                }
                else {
                  iVar13 = ModifiedGS(v,h,iVar12,p,new_vk_norm);
                }
                if (iVar13 != 0) {
                  *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff8;
                  uVar19 = 0xfffffff8;
                  goto LAB_0010300c;
                }
                iVar12 = QRfact(iVar12,h,q,(int)uVar19);
                if (iVar12 != 0) {
                  *(undefined8 *)((long)S->content + 0x20) = 7;
                  uVar19 = 7;
                  goto LAB_0010300c;
                }
                local_138 = local_138 * *(double *)((long)q + lVar20 * 2);
                local_48 = ABS((double)local_108._0_8_ * local_138);
                *(double *)(puVar5 + 6) = local_48;
                if (local_48 <= delta) {
                  uVar18 = (ulong)((int)uVar19 + 1);
                  break;
                }
                N_VScale(1.0 / h[uVar19 + 1][uVar19],v[uVar19 + 1],v[uVar19 + 1]);
                bVar11 = (long)uVar1 < (long)(int)p;
                lVar20 = lVar20 + 8;
                uVar19 = uVar1;
                uVar18 = uVar14;
              } while (uVar14 != uVar1);
            }
          }
          *b_00 = (realtype)local_108._0_8_;
          iVar12 = (int)uVar18;
          if (0 < iVar12) {
            memset(b_00 + 1,0,uVar18 * 8);
          }
          iVar13 = QRsol(iVar12,h,q,b_00);
          if (iVar13 != 0) {
            *(undefined8 *)((long)S->content + 0x20) = 0xfffffffffffffff7;
            uVar19 = 0xfffffff7;
            break;
          }
          *stemp = 1.0;
          *vtemp = z;
          if (0 < iVar12) {
            uVar19 = 0;
            do {
              stemp[uVar19 + 1] = b_00[uVar19];
              vtemp[uVar19 + 1] = *(N_Vector *)(lVar6 + uVar19 * 8);
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
          nvec = iVar12 + 1;
          iVar13 = N_VLinearCombination(nvec,stemp,vtemp,z);
          uVar19 = 0xfffffff6;
          if (iVar13 != 0) break;
          if (bVar11) {
            N_VLinearSum(1.0,x,1.0,z,x);
            pvVar16 = S->content;
            goto LAB_00102eeb;
          }
          if (uVar17 == uVar3) {
            if (dVar22 <= local_48) goto LAB_00102ffc;
            N_VLinearSum(1.0,x,1.0,z,x);
            *(undefined8 *)((long)S->content + 0x20) = 1;
            uVar19 = 1;
            break;
          }
          dVar23 = 1.0;
          if (0 < iVar12) {
            pdVar15 = q + uVar18 * 2 + -1;
            uVar19 = uVar18 + 1;
            dVar23 = 1.0;
            do {
              b_00[uVar19 - 1] = pdVar15[-1] * dVar23;
              dVar23 = dVar23 * *pdVar15;
              pdVar15 = pdVar15 + -2;
              uVar19 = uVar19 - 1;
            } while (1 < uVar19);
          }
          *b_00 = dVar23;
          local_108._0_8_ = (double)local_108._0_8_ * dVar23;
          if (iVar12 < 0) {
            uVar19 = local_108._8_8_ & 0x7fffffffffffffff;
            local_108._8_4_ = (int)uVar19;
            local_108._0_8_ = ABS((double)local_108._0_8_);
            local_108._12_4_ = (int)(uVar19 >> 0x20);
          }
          else {
            uVar19 = 0;
            do {
              b_00[uVar19] = b_00[uVar19] * (double)local_108._0_8_;
              uVar19 = uVar19 + 1;
            } while (nvec != uVar19);
            uVar19 = local_108._8_8_ & 0x7fffffffffffffff;
            local_108._8_4_ = (int)uVar19;
            local_108._0_8_ = ABS((double)local_108._0_8_);
            local_108._12_4_ = (int)(uVar19 >> 0x20);
            if (-1 < iVar12) {
              uVar19 = 0;
              do {
                stemp[uVar19] = b_00[uVar19];
                vtemp[uVar19] = v[uVar19];
                uVar19 = uVar19 + 1;
              } while (nvec != uVar19);
            }
          }
          iVar12 = N_VLinearCombination(nvec,stemp,vtemp,*v);
          uVar17 = uVar17 + 1;
          uVar19 = 0xfffffff6;
        } while (iVar12 == 0);
      }
    }
  }
LAB_0010300c:
  return (int)uVar19;
}

Assistant:

int SUNLinSolSolve_SPFGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x, 
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, *Z, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnRight, scale1, scale2, converged;
  int i, j, k, l, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  ATimesFn atimes;
  PSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPFGMR_CONTENT(S)->maxl;
  max_restarts = SPFGMR_CONTENT(S)->max_restarts;
  gstype       = SPFGMR_CONTENT(S)->gstype;
  V            = SPFGMR_CONTENT(S)->V;
  Z            = SPFGMR_CONTENT(S)->Z;
  Hes          = SPFGMR_CONTENT(S)->Hes;
  givens       = SPFGMR_CONTENT(S)->givens;
  xcor         = SPFGMR_CONTENT(S)->xcor;
  yg           = SPFGMR_CONTENT(S)->yg;
  vtemp        = SPFGMR_CONTENT(S)->vtemp;
  s1           = SPFGMR_CONTENT(S)->s1;
  s2           = SPFGMR_CONTENT(S)->s2;
  A_data       = SPFGMR_CONTENT(S)->ATData;
  P_data       = SPFGMR_CONTENT(S)->PData;
  atimes       = SPFGMR_CONTENT(S)->ATimes;
  psolve       = SPFGMR_CONTENT(S)->Psolve;
  nli          = &(SPFGMR_CONTENT(S)->numiters);
  res_norm     = &(SPFGMR_CONTENT(S)->resnorm);
  cv           = SPFGMR_CONTENT(S)->cv;
  Xv           = SPFGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* set booleantype flags for internal solver options */
  preOnRight = ( (SPFGMR_CONTENT(S)->pretype == PREC_LEFT) ||
                 (SPFGMR_CONTENT(S)->pretype == PREC_RIGHT) || 
                 (SPFGMR_CONTENT(S)->pretype == PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (N_VDotProd(x, x) == ZERO) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ? 
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }

  /* Apply left scaling to vtemp = r_0 to fill V[0]. */
  if (scale1) {
    N_VProd(s1, vtemp, V[0]);   
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 r_0, and return if small */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));
  if (r_norm <= delta) {
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0. */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts. */
  for (ntries=0; ntries<=max_restarts; ntries++) {
    
    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0].             */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;
    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);
    
    /* Inner loop: generate Krylov sequence and Arnoldi basis. */
    for (l=0; l<l_max; l++) {
      
      (*nli)++;
      
      krydim = l + 1;
      
      /* Generate A-tilde V[l], where A-tilde = s1 A P_inv s2_inv. */

      /*   Apply right scaling: vtemp = s2_inv V[l]. */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);
      
      /*   Apply right preconditioner: vtemp = Z[l] = P_inv s2_inv V[l]. */ 
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l+1]);
        ier = psolve(P_data, V[l+1], vtemp, delta, PREC_RIGHT);
        if (ier != 0) {
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }
      N_VScale(ONE, vtemp, Z[l]);
      
      /*   Apply A: V[l+1] = A P_inv s2_inv V[l]. */
      ier = atimes(A_data, vtemp, V[l+1]);
      if (ier != 0) {
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /*   Apply left scaling: V[l+1] = s1 A P_inv s2_inv V[l]. */
      if (scale1)  N_VProd(s1, V[l+1], V[l+1]);
      
      /* Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde. */
      if (gstype == CLASSICAL_GS) {
        if (ClassicalGS(V, Hes, l+1, l_max, &(Hes[l+1][l]), cv, Xv) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (ModifiedGS(V, Hes, l+1, l_max, &(Hes[l+1][l])) != 0) {
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }
      
      /* Update the QR factorization of Hes. */
      if(QRfact(krydim, Hes, givens, l) != 0 ) {
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }
      
      /* Update residual norm estimate; break if convergence test passes. */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);
      if (rho <= delta) { converged = SUNTRUE; break; }
      
      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine. */
      N_VScale(ONE/Hes[l+1][l], V[l+1], V[l+1]);
    }
    
    /* Inner loop is done.  Compute the new correction vector xcor. */
    
    /*   Construct g, then solve for y. */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++)  yg[i]=ZERO;
    if (QRsol(krydim, Hes, givens, yg) != 0) {
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }
    
    /*   Add correction vector Z_l y to xcor. */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = Z[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);

    /* If converged, construct the final solution vector x and return. */
    if (converged) {
      N_VLinearSum(ONE, x, ONE, xcor, x); {
        LASTFLAG(S) = SUNLS_SUCCESS;
        return(LASTFLAG(S));
      }
    }
    
    /* Not yet converged; if allowed, prepare for restart. */
    if (ntries == max_restarts) break;
    
    /* Construct last column of Q in yg. */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;
    
    /* Scale r_norm and yg. */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);
    
    /* Multiply yg by V_(krydim+1) to get last residual vector; restart. */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) return(SUNLS_VECTOROP_ERR);
    
  }
  
  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {
    N_VLinearSum(ONE, x, ONE, xcor, x); {
      LASTFLAG(S) = SUNLS_RES_REDUCED;
      return(LASTFLAG(S));
    }
  }

  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S)); 
}